

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall Material::UpdateFrom(Material *this,Position *pos)

{
  Piece **ppPVar1;
  uint square;
  long lVar2;
  long lVar3;
  long local_218 [65];
  
  Initialize(this);
  memcpy(local_218,(pos->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase.m_Piece,
         0x200);
  ppPVar1 = AllPieces;
  lVar2 = 0;
  do {
    if (lVar2 == 0x40) {
      return;
    }
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
      if (((Piece *)local_218[lVar2] != &None.super_Piece) &&
         ((Piece *)local_218[lVar2] == ppPVar1[lVar3])) {
        this->m_nCount[lVar3] = this->m_nCount[lVar3] + 1;
        break;
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void Material::UpdateFrom( const Position &pos )
{
    Initialize();
    Board board = pos.GetBoard();
    for ( unsigned int square = 0; square < MAX_SQUARES; square++ )
    {
        const Piece *pPiece = board.Get( square );
        for ( int p = 0; p < AllPiecesSize; p++ )
        {
            if ( pPiece == &None )
                continue;

            if ( pPiece == AllPieces[p] )
            {
                m_nCount[p]++;
                break;
            }
        }
    }
}